

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2cell_id_vector.cc
# Opt level: O0

vector<S2CellId,_std::allocator<S2CellId>_> * __thiscall
s2coding::EncodedS2CellIdVector::Decode
          (vector<S2CellId,_std::allocator<S2CellId>_> *__return_storage_ptr__,
          EncodedS2CellIdVector *this)

{
  size_t sVar1;
  S2CellId SVar2;
  reference pvVar3;
  int local_30;
  int i;
  allocator<S2CellId> local_1a;
  undefined1 local_19;
  EncodedS2CellIdVector *local_18;
  EncodedS2CellIdVector *this_local;
  vector<S2CellId,_std::allocator<S2CellId>_> *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (EncodedS2CellIdVector *)__return_storage_ptr__;
  sVar1 = size(this);
  std::allocator<S2CellId>::allocator(&local_1a);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector(__return_storage_ptr__,sVar1,&local_1a);
  std::allocator<S2CellId>::~allocator(&local_1a);
  for (local_30 = 0; sVar1 = size(this), (ulong)(long)local_30 < sVar1; local_30 = local_30 + 1) {
    SVar2 = operator[](this,local_30);
    pvVar3 = std::vector<S2CellId,_std::allocator<S2CellId>_>::operator[]
                       (__return_storage_ptr__,(long)local_30);
    pvVar3->id_ = SVar2.id_;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<S2CellId> EncodedS2CellIdVector::Decode() const {
  vector<S2CellId> result(size());
  for (int i = 0; i < size(); ++i) {
    result[i] = (*this)[i];
  }
  return result;
}